

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

int lj_tab_next(GCtab *t,cTValue *key,TValue *o)

{
  TValue *pTVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  TValue TVar6;
  uint64_t *puVar7;
  uint32_t uVar5;
  
  uVar3 = lj_tab_keyindex(t,key);
  uVar4 = t->asize;
  uVar5 = uVar3;
  if (uVar3 < uVar4) {
    puVar7 = (uint64_t *)((ulong)uVar3 * 8 + (t->array).ptr64);
    do {
      if (*puVar7 != 0xffffffffffffffff) {
        o->n = (double)(int)uVar3;
        TVar6.u64 = *puVar7;
        goto LAB_00129a3b;
      }
      uVar3 = uVar3 + 1;
      puVar7 = puVar7 + 1;
      uVar5 = uVar4;
    } while (uVar4 != uVar3);
  }
  uVar4 = uVar5 - uVar4;
  if (uVar4 <= t->hmask) {
    uVar2 = (t->node).ptr64;
    do {
      if (*(long *)(uVar2 + (ulong)uVar4 * 0x18) != -1) {
        pTVar1 = (TValue *)(uVar2 + (ulong)uVar4 * 0x18);
        *o = pTVar1[1];
        TVar6 = *pTVar1;
LAB_00129a3b:
        o[1] = TVar6;
        return 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= t->hmask);
  }
  return (int)uVar4 >> 0x1f;
}

Assistant:

int lj_tab_next(GCtab *t, cTValue *key, TValue *o)
{
  uint32_t idx = lj_tab_keyindex(t, key);  /* Find successor index of key. */
  /* First traverse the array part. */
  for (; idx < t->asize; idx++) {
    cTValue *a = arrayslot(t, idx);
    if (LJ_LIKELY(!tvisnil(a))) {
      setintV(o, idx);
      o[1] = *a;
      return 1;
    }
  }
  idx -= t->asize;
  /* Then traverse the hash part. */
  for (; idx <= t->hmask; idx++) {
    Node *n = &noderef(t->node)[idx];
    if (!tvisnil(&n->val)) {
      o[0] = n->key;
      o[1] = n->val;
      return 1;
    }
  }
  return (int32_t)idx < 0 ? -1 : 0;  /* Invalid key or end of traversal. */
}